

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_find_best_ref_mvs
               (int allow_hp,int_mv *mvlist,int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  MV *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  int in_R8D;
  int i;
  int is_integer_00;
  
  for (is_integer_00 = 0; is_integer_00 < 2; is_integer_00 = is_integer_00 + 1) {
    lower_mv_precision(in_RCX,in_R8D,is_integer_00);
  }
  *in_RDX = *in_RSI;
  *in_RCX = *(MV *)(in_RSI + 1);
  return;
}

Assistant:

void av1_find_best_ref_mvs(int allow_hp, int_mv *mvlist, int_mv *nearest_mv,
                           int_mv *near_mv, int is_integer) {
  int i;
  // Make sure all the candidates are properly clamped etc
  for (i = 0; i < MAX_MV_REF_CANDIDATES; ++i) {
    lower_mv_precision(&mvlist[i].as_mv, allow_hp, is_integer);
  }
  *nearest_mv = mvlist[0];
  *near_mv = mvlist[1];
}